

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O2

void __thiscall Filter::reset(Filter *this)

{
  this->fc = 0;
  this->res = 0;
  this->filt = 0;
  this->voice3off = 0;
  this->hp_bp_lp = 0;
  this->vol = 0;
  this->Vhp = 0;
  this->Vbp = 0;
  this->Vlp = 0;
  this->Vnf = 0;
  set_w0(this);
  this->_1024_div_Q = (int)(1024.0 / ((double)this->res / 15.0 + 0.707));
  return;
}

Assistant:

void Filter::reset()
{
  fc = 0;

  res = 0;

  filt = 0;

  voice3off = 0;

  hp_bp_lp = 0;

  vol = 0;

  // State of filter.
  Vhp = 0;
  Vbp = 0;
  Vlp = 0;
  Vnf = 0;

  set_w0();
  set_Q();
}